

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_tests.cpp
# Opt level: O0

void __thiscall Inject::inject_without_component::test_method(inject_without_component *this)

{
  undefined8 uVar1;
  bool bVar2;
  lazy_ostream *prev;
  no_component *e;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[24],_const_char_(&)[24]> local_f8;
  assertion_result local_d8;
  basic_cstring<const_char> local_c0;
  basic_cstring<const_char> local_b0 [2];
  undefined1 local_90 [8];
  injected<Inject::service> x;
  context<0> c;
  inject_without_component *this_local;
  
  inject::context<0>::context((context<0> *)&x._ptr.pn);
  inject::context<0>::injected<Inject::service>::injected((injected<Inject::service> *)local_90);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (local_b0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
               ,0x65);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_c0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,local_b0,0x90,&local_c0);
    boost::test_tools::assertion_result::assertion_result(&local_d8,false);
    prev = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_f8,prev,(char (*) [24])"no_component not thrown");
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)&e,
               "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
               ,0x65);
    boost::test_tools::tt_detail::report_assertion(&local_d8,&local_f8,&e,0x90,1,1,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[24],_const_char_(&)[24]>::
    ~lazy_ostream_impl(&local_f8);
    boost::test_tools::assertion_result::~assertion_result(&local_d8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  inject::context<0>::injected<Inject::service>::~injected((injected<Inject::service> *)local_90);
  inject::context<0>::~context((context<0> *)&x._ptr.pn);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(inject_without_component)
{
    context<> c;
    try {
        context<>::injected<service> x;
        BOOST_ERROR("no_component not thrown");
    } catch (const no_component& e) {
        BOOST_CHECK_EQUAL(e.id(), id_of<service>::id());
    }
}